

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O3

void __thiscall llvm::APFloat::Storage::~Storage(Storage *this)

{
  fltSemantics *pfVar1;
  fltSemantics *pfVar2;
  
  pfVar1 = *(fltSemantics **)this;
  pfVar2 = APFloatBase::PPCDoubleDouble();
  if (pfVar2 != pfVar1) {
    detail::IEEEFloat::~IEEEFloat((IEEEFloat *)this);
    return;
  }
  if (*(APFloat **)(this + 8) != (APFloat *)0x0) {
    std::default_delete<llvm::APFloat[]>::operator()
              ((default_delete<llvm::APFloat[]> *)(this + 8),*(APFloat **)(this + 8));
  }
  *(undefined8 *)(this + 8) = 0;
  return;
}

Assistant:

~Storage() {
      if (usesLayout<IEEEFloat>(*semantics)) {
        IEEE.~IEEEFloat();
        return;
      }
      if (usesLayout<DoubleAPFloat>(*semantics)) {
        Double.~DoubleAPFloat();
        return;
      }
      llvm_unreachable("Unexpected semantics");
    }